

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O1

void __thiscall
OpenMD::Thermo::getInertiaTensor(Thermo *this,Mat3x3d *inertiaTensor,Vector3d *angularMomentum)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  uint i_1;
  Molecule *pMVar4;
  double (*padVar5) [3];
  double *pdVar6;
  uint i_6;
  long lVar7;
  double *pdVar8;
  double (*padVar9) [3];
  pointer ppSVar10;
  long lVar11;
  double *pdVar12;
  uint k;
  long lVar13;
  StuntDouble *this_00;
  Snapshot *this_01;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  SquareMatrix3<double> result_5;
  MoleculeIterator i;
  Vector<double,_3U> result;
  Mat3x3d Itmp;
  SquareMatrix3<double> result_3;
  SquareMatrix3<double> result_4;
  double local_2e8 [10];
  double local_298;
  double dStack_290;
  double local_288;
  undefined8 uStack_280;
  double local_278;
  undefined8 uStack_270;
  double local_268;
  double dStack_260;
  Snapshot *local_250;
  double (*local_248) [3];
  MoleculeIterator local_240;
  double local_238 [10];
  Mat3x3d local_1e8;
  double local_198;
  double dStack_190;
  double local_188;
  undefined8 uStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158 [10];
  double local_108 [10];
  Vector3d local_b8;
  Vector3d local_98;
  double local_78 [9];
  
  this_01 = this->info_->sman_->currentSnapshot_;
  if ((this_01->hasInertiaTensor != true) || (this_01->hasCOMw == false)) {
    local_98.super_Vector<double,_3U>.data_[0] = 0.0;
    local_98.super_Vector<double,_3U>.data_[1] = 0.0;
    local_98.super_Vector<double,_3U>.data_[2] = 0.0;
    local_b8.super_Vector<double,_3U>.data_[2] = 0.0;
    local_b8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_b8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_250 = this_01;
    local_248 = (double (*) [3])inertiaTensor;
    getComAll(this,&local_98,&local_b8);
    local_240._M_node = (_Base_ptr)0x0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
    local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1] = 0.0;
    pMVar4 = SimInfo::beginMolecule(this->info_,&local_240);
    if (pMVar4 == (Molecule *)0x0) {
      dVar15 = 0.0;
      dVar16 = 0.0;
      dVar17 = 0.0;
      dVar14 = 0.0;
      dVar20 = 0.0;
      dVar18 = 0.0;
    }
    else {
      local_278 = 0.0;
      uStack_270 = 0;
      local_288 = 0.0;
      uStack_280 = 0;
      local_268 = 0.0;
      dStack_260 = 0.0;
      local_298 = 0.0;
      dStack_290 = 0.0;
      do {
        ppSVar10 = (pMVar4->integrableObjects_).
                   super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        if (ppSVar10 ==
            (pMVar4->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          this_00 = (StuntDouble *)0x0;
        }
        else {
          this_00 = *ppSVar10;
        }
        while (this_00 != (StuntDouble *)0x0) {
          lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).position.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          local_2e8[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)this_00->localIndex_ * 0x18);
          pdVar6 = (double *)(lVar7 + (long)this_00->localIndex_ * 0x18);
          local_2e8[0] = *pdVar6;
          local_2e8[1] = pdVar6[1];
          local_238[0] = 0.0;
          local_238[1] = 0.0;
          local_238[2] = 0.0;
          lVar7 = 0;
          do {
            local_238[lVar7] = local_2e8[lVar7] - local_98.super_Vector<double,_3U>.data_[lVar7];
            dVar17 = local_238[2];
            dVar16 = local_238[1];
            dVar15 = local_238[0];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).velocity.
                                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
          local_2e8[2] = (double)*(undefined8 *)(lVar7 + 0x10 + (long)this_00->localIndex_ * 0x18);
          pdVar6 = (double *)(lVar7 + (long)this_00->localIndex_ * 0x18);
          local_2e8[0] = *pdVar6;
          local_2e8[1] = pdVar6[1];
          local_238[0] = 0.0;
          local_238[1] = 0.0;
          local_238[2] = 0.0;
          lVar7 = 0;
          do {
            local_238[lVar7] = local_2e8[lVar7] - local_b8.super_Vector<double,_3U>.data_[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          dVar18 = dVar15 * dVar16;
          dVar19 = dVar16 * dVar16;
          dVar20 = dVar16 * dVar17;
          dVar14 = this_00->mass_;
          local_2e8[0] = local_238[2] * dVar16 - dVar17 * local_238[1];
          local_2e8[1] = local_238[0] * dVar17 - dVar15 * local_238[2];
          local_2e8[2] = dVar15 * local_238[1] - dVar16 * local_238[0];
          local_238[0] = 0.0;
          local_238[1] = 0.0;
          local_238[2] = 0.0;
          lVar7 = 0;
          do {
            local_238[lVar7] = local_2e8[lVar7] * dVar14;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          local_268 = local_268 + dVar15 * dVar15 * dVar14;
          dStack_260 = dStack_260 + dVar17 * dVar17 * dVar14;
          local_288 = local_288 + dVar15 * dVar17 * dVar14;
          lVar7 = 0;
          do {
            (angularMomentum->super_Vector<double,_3U>).data_[lVar7] =
                 local_238[lVar7] + (angularMomentum->super_Vector<double,_3U>).data_[lVar7];
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          dVar15 = dVar14;
          dVar17 = dVar14;
          if (this_00->objType_ - otDAtom < 2) {
            uStack_180 = 0;
            dStack_170 = dVar16;
            local_198 = dVar14;
            dStack_190 = dVar14;
            local_188 = dVar14;
            local_178 = dVar20;
            local_168 = dVar18;
            dStack_160 = dVar19;
            StuntDouble::getA((RotMat3x3d *)local_238,this_00);
            local_158[6] = 0.0;
            local_158[7] = 0.0;
            local_158[4] = 0.0;
            local_158[5] = 0.0;
            local_158[2] = 0.0;
            local_158[3] = 0.0;
            local_158[0] = 0.0;
            local_158[1] = 0.0;
            local_158[8] = 0.0;
            pdVar6 = local_158;
            lVar7 = 0;
            padVar5 = (double (*) [3])local_238;
            do {
              lVar11 = 0;
              pdVar8 = pdVar6;
              do {
                *pdVar8 = (((SquareMatrix<double,_3> *)*padVar5)->super_RectMatrix<double,_3U,_3U>).
                          data_[0][lVar11];
                lVar11 = lVar11 + 1;
                pdVar8 = pdVar8 + 3;
              } while (lVar11 != 3);
              lVar7 = lVar7 + 1;
              pdVar6 = pdVar6 + 1;
              padVar5 = padVar5 + 1;
            } while (lVar7 != 3);
            (*this_00->_vptr_StuntDouble[5])(local_78);
            dVar19 = dStack_160;
            dVar18 = local_168;
            dVar20 = local_178;
            dVar17 = local_188;
            dVar15 = dStack_190;
            dVar14 = local_198;
            local_108[6] = 0.0;
            local_108[7] = 0.0;
            local_108[4] = 0.0;
            local_108[5] = 0.0;
            local_108[2] = 0.0;
            local_108[3] = 0.0;
            local_108[0] = 0.0;
            local_108[1] = 0.0;
            local_108[8] = 0.0;
            pdVar6 = local_158;
            lVar7 = 0;
            do {
              lVar11 = 0;
              pdVar8 = local_78;
              do {
                dVar16 = local_108[lVar7 * 3 + lVar11];
                lVar13 = 0;
                pdVar12 = pdVar8;
                do {
                  dVar16 = dVar16 + pdVar6[lVar13] * *pdVar12;
                  lVar13 = lVar13 + 1;
                  pdVar12 = pdVar12 + 3;
                } while (lVar13 != 3);
                local_108[lVar7 * 3 + lVar11] = dVar16;
                lVar11 = lVar11 + 1;
                pdVar8 = pdVar8 + 1;
              } while (lVar11 != 3);
              lVar7 = lVar7 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar7 != 3);
            local_2e8[6] = 0.0;
            local_2e8[7] = 0.0;
            local_2e8[4] = 0.0;
            local_2e8[5] = 0.0;
            local_2e8[2] = 0.0;
            local_2e8[3] = 0.0;
            local_2e8[0] = 0.0;
            local_2e8[1] = 0.0;
            local_2e8[8] = 0.0;
            pdVar6 = local_108;
            lVar7 = 0;
            do {
              lVar11 = 0;
              padVar5 = (double (*) [3])local_238;
              do {
                dVar16 = local_2e8[lVar7 * 3 + lVar11];
                lVar13 = 0;
                padVar9 = padVar5;
                do {
                  dVar16 = dVar16 + pdVar6[lVar13] * (*padVar9)[0];
                  lVar13 = lVar13 + 1;
                  padVar9 = padVar9 + 1;
                } while (lVar13 != 3);
                local_2e8[lVar7 * 3 + lVar11] = dVar16;
                lVar11 = lVar11 + 1;
                padVar5 = (double (*) [3])(*padVar5 + 1);
              } while (lVar11 != 3);
              lVar7 = lVar7 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar7 != 3);
            pdVar6 = local_2e8;
            padVar5 = (double (*) [3])&local_1e8;
            lVar7 = 0;
            do {
              lVar11 = 0;
              do {
                (((SquareMatrix<double,_3> *)*padVar5)->super_RectMatrix<double,_3U,_3U>).data_[0]
                [lVar11] = pdVar6[lVar11] +
                           (((SquareMatrix<double,_3> *)*padVar5)->super_RectMatrix<double,_3U,_3U>)
                           .data_[0][lVar11];
                lVar11 = lVar11 + 1;
              } while (lVar11 != 3);
              lVar7 = lVar7 + 1;
              padVar5 = padVar5 + 1;
              pdVar6 = pdVar6 + 3;
            } while (lVar7 != 3);
            lVar7 = *(long *)((long)&(this_00->snapshotMan_->currentSnapshot_->atomData).
                                     angularMomentum.
                                     super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + this_00->storage_);
            local_2e8[2] = *(double *)(lVar7 + 0x10 + (long)this_00->localIndex_ * 0x18);
            pdVar6 = (double *)(lVar7 + (long)this_00->localIndex_ * 0x18);
            local_2e8[0] = *pdVar6;
            local_2e8[1] = pdVar6[1];
            lVar7 = 0;
            do {
              (angularMomentum->super_Vector<double,_3U>).data_[lVar7] =
                   local_2e8[lVar7] + (angularMomentum->super_Vector<double,_3U>).data_[lVar7];
              lVar7 = lVar7 + 1;
            } while (lVar7 != 3);
          }
          ppSVar10 = ppSVar10 + 1;
          if (ppSVar10 ==
              (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            this_00 = (StuntDouble *)0x0;
          }
          else {
            this_00 = *ppSVar10;
          }
          local_298 = local_298 + dVar18 * dVar14;
          dStack_290 = dStack_290 + dVar19 * dVar15;
          local_278 = local_278 + dVar20 * dVar17;
        }
        pMVar4 = SimInfo::nextMolecule(this->info_,&local_240);
        dVar15 = local_268;
        dVar16 = dStack_260;
        dVar17 = local_278;
        dVar14 = local_288;
        dVar20 = local_298;
        dVar18 = dStack_290;
      } while (pMVar4 != (Molecule *)0x0);
    }
    inertiaTensor = (Mat3x3d *)local_248;
    this_01 = local_250;
    (*local_248)[0] = dVar18 + dVar16;
    (*local_248)[1] = -dVar20;
    (*local_248)[2] = -dVar14;
    local_248[1][0] = -dVar20;
    local_248[1][1] = dVar16 + dVar15;
    auVar2._8_4_ = SUB84(dVar14,0);
    auVar2._0_8_ = -dVar17;
    auVar2._12_4_ = (int)((ulong)-dVar14 >> 0x20);
    *(undefined1 (*) [16])(local_248[1] + 2) = auVar2;
    *(double *)((long)(local_248 + 2) + 8) = -dVar17;
    *(double *)((long)(local_248 + 2) + 0x10) = dVar18 + dVar15;
    padVar5 = (double (*) [3])&local_1e8;
    lVar7 = 0;
    padVar9 = local_248;
    do {
      lVar11 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar11] =
             (((SquareMatrix<double,_3> *)*padVar5)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar11] +
             (((SquareMatrix<double,_3> *)*padVar9)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar11];
        lVar11 = lVar11 + 1;
      } while (lVar11 != 3);
      lVar7 = lVar7 + 1;
      padVar9 = padVar9 + 1;
      padVar5 = padVar5 + 1;
    } while (lVar7 != 3);
    Snapshot::setCOMw(local_250,angularMomentum);
    Snapshot::setInertiaTensor(this_01,inertiaTensor);
  }
  Snapshot::getCOMw((Vector3d *)&local_1e8,this_01);
  if (&local_1e8 != (Mat3x3d *)angularMomentum) {
    (angularMomentum->super_Vector<double,_3U>).data_[2] =
         local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][2];
    (angularMomentum->super_Vector<double,_3U>).data_[0] =
         local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    (angularMomentum->super_Vector<double,_3U>).data_[1] =
         local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][1];
  }
  Snapshot::getInertiaTensor(&local_1e8,this_01);
  if (&local_1e8 != inertiaTensor) {
    lVar7 = 0;
    do {
      *(undefined8 *)
       ((long)(((SquareMatrix<double,_3> *)*(double (*) [3])inertiaTensor)->
              super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7 + 0x10) =
           *(undefined8 *)
            ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0]
            + lVar7 + 0x10);
      uVar3 = *(undefined8 *)
               ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                      [0] + lVar7 + 8);
      puVar1 = (undefined8 *)
               ((long)(((SquareMatrix<double,_3> *)*(double (*) [3])inertiaTensor)->
                      super_RectMatrix<double,_3U,_3U>).data_[0] + lVar7);
      *puVar1 = *(undefined8 *)
                 ((long)local_1e8.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
                        data_[0] + lVar7);
      puVar1[1] = uVar3;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
  }
  return;
}

Assistant:

void Thermo::getInertiaTensor(Mat3x3d& inertiaTensor,
                                Vector3d& angularMomentum) {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();
    Molecule::IntegrableObjectIterator j;
    StuntDouble* sd;

    if (!(snap->hasInertiaTensor && snap->hasCOMw)) {
      RealType xx = 0.0;
      RealType yy = 0.0;
      RealType zz = 0.0;
      RealType xy = 0.0;
      RealType xz = 0.0;
      RealType yz = 0.0;
      Vector3d com(0.0);
      Vector3d comVel(0.0);

      getComAll(com, comVel);

      SimInfo::MoleculeIterator i;
      Molecule* mol;

      Vector3d r(0.0);
      Vector3d v(0.0);
      Mat3x3d Itmp {};

      RealType m = 0.0;

      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          r = sd->getPos() - com;
          v = sd->getVel() - comVel;

          m = sd->getMass();

          // Compute moment of intertia coefficients.
          xx += r[0] * r[0] * m;
          yy += r[1] * r[1] * m;
          zz += r[2] * r[2] * m;

          // compute products of intertia
          xy += r[0] * r[1] * m;
          xz += r[0] * r[2] * m;
          yz += r[1] * r[2] * m;

          angularMomentum += cross(r, v) * m;

          if (sd->isDirectional()) {
            RotMat3x3d A = sd->getA();
            Itmp += A.transpose() * sd->getI() * A;
            angularMomentum += sd->getJ();
          }
        }
      }

      inertiaTensor(0, 0) = yy + zz;
      inertiaTensor(0, 1) = -xy;
      inertiaTensor(0, 2) = -xz;
      inertiaTensor(1, 0) = -xy;
      inertiaTensor(1, 1) = xx + zz;
      inertiaTensor(1, 2) = -yz;
      inertiaTensor(2, 0) = -xz;
      inertiaTensor(2, 1) = -yz;
      inertiaTensor(2, 2) = xx + yy;

      inertiaTensor += Itmp;

#ifdef IS_MPI
      MPI_Allreduce(MPI_IN_PLACE, inertiaTensor.getArrayPointer(), 9,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
      MPI_Allreduce(MPI_IN_PLACE, angularMomentum.getArrayPointer(), 3,
                    MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

      snap->setCOMw(angularMomentum);
      snap->setInertiaTensor(inertiaTensor);
    }

    angularMomentum = snap->getCOMw();
    inertiaTensor   = snap->getInertiaTensor();

    return;
  }